

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_Next_Word(FORM *form)

{
  FIELD *pFVar1;
  char *pcVar2;
  char *t;
  char *s;
  char *bp;
  FIELD *field;
  FORM *form_local;
  
  pFVar1 = form->current;
  pcVar2 = form->current->buf + (long)form->curcol + (long)(form->currow * form->current->dcols);
  Synchronize_Buffer(form);
  pcVar2 = Get_First_Whitespace_Character
                     (pcVar2,pFVar1->drows * pFVar1->dcols - ((int)pcVar2 - (int)pFVar1->buf));
  pcVar2 = Get_Start_Of_Data(pcVar2,pFVar1->drows * pFVar1->dcols - ((int)pcVar2 - (int)pFVar1->buf)
                            );
  Adjust_Cursor_Position(form,pcVar2);
  return 0;
}

Assistant:

static int IFN_Next_Word(FORM * form)
{
  FIELD *field = form->current;
  char  *bp    = Address_Of_Current_Position_In_Buffer(form);
  char  *s;
  char  *t;

  /* We really need access to the data, so we have to synchronize */
  Synchronize_Buffer(form);

  /* Go to the first whitespace after the current position (including
     current position). This is then the startpoint to look for the
    next non-blank data */
  s = Get_First_Whitespace_Character(bp,Buffer_Length(field) -
                                     (int)(bp - field->buf));

  /* Find the start of the next word */
  t = Get_Start_Of_Data(s,Buffer_Length(field) -
                        (int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
  if (s==t) 
    return(E_REQUEST_DENIED);
  else
#endif
    {
      Adjust_Cursor_Position(form,t);
      return(E_OK);
    }
}